

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

GLuint glcts::findMSBU(GLuint input)

{
  GLuint GVar1;
  
  if (input != 0) {
    GVar1 = 0x1f;
    if (-1 < (int)input) {
      do {
        input = input * 2;
        GVar1 = GVar1 - 1;
      } while (-1 < (int)input);
    }
    return GVar1;
  }
  return 0xffffffff;
}

Assistant:

static GLuint findMSBU(GLuint input)
{
	if (!input)
	{
		return -1;
	}
	for (GLuint result = 31;; --result)
	{
		if (input & 0x80000000)
		{
			return result;
		}
		input <<= 1;
	}
}